

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata_test.cc
# Opt level: O0

void __thiscall
libaom_examples::anon_unknown_0::MultilayerMetadataTest_ParseInvalid_Test::
~MultilayerMetadataTest_ParseInvalid_Test(MultilayerMetadataTest_ParseInvalid_Test *this)

{
  void *in_RDI;
  
  ~MultilayerMetadataTest_ParseInvalid_Test((MultilayerMetadataTest_ParseInvalid_Test *)0xdcdb38);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(MultilayerMetadataTest, ParseInvalid) {
  const std::string metadata = R"(

use_case: 1 # global alpha
layers:
  - layer_type: 5 # alpha
    luma_plane_only_flag: 1
    layer_metadata_scope: 2 # global

  - layer_type: 1 # texture
    luma_plane_only_flag: 0
    layer_metadata_scope: 2 # global

  - layer_type: 6 # depth => bad layer type
    luma_plane_only_flag: 1
    layer_metadata_scope: 2 # global
    )";
  libaom_test::TempOutFile tmp_file(/*text_mode=*/true);
  fprintf(tmp_file.file(), "%s", metadata.c_str());
  fflush(tmp_file.file());

  MultilayerMetadata multilayer;
  // Invalid: has a depth layer even though use_case is alpha
  EXPECT_FALSE(
      parse_multilayer_file(tmp_file.file_name().c_str(), &multilayer));
}